

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O1

void __thiscall NaDynAr<NaNNUnit>::item::~item(item *this)

{
  if (this->pData == (NaNNUnit *)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
  }
  if (this->pData != (NaNNUnit *)0x0) {
    (**(code **)(*(long *)this->pData + 0x10))();
  }
  this->pData = (NaNNUnit *)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }